

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmganalysis.cpp
# Opt level: O0

void __thiscall TPZMGAnalysis::TPZMGAnalysis(TPZMGAnalysis *this,TPZCompMesh *cmesh)

{
  TPZLinearAnalysis *in_RSI;
  ostream *in_RDI;
  TPZCompMesh *object;
  undefined8 in_stack_ffffffffffffffd8;
  TPZCompMesh *in_stack_ffffffffffffffe0;
  void **in_stack_ffffffffffffffe8;
  
  TPZLinearAnalysis::TPZLinearAnalysis
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
             SUB81((ulong)in_stack_ffffffffffffffd8 >> 0x38,0),in_RDI);
  *(undefined ***)in_RDI = &PTR__TPZMGAnalysis_0252d720;
  TPZStack<TPZCompMesh_*,_10>::TPZStack((TPZStack<TPZCompMesh_*,_10> *)in_RDI);
  object = (TPZCompMesh *)(in_RDI + 0x4f8);
  TPZStack<TPZSolutionMatrix_*,_10>::TPZStack((TPZStack<TPZSolutionMatrix_*,_10> *)in_RDI);
  TPZStack<TPZMatrixSolver<double>_*,_10>::TPZStack
            ((TPZStack<TPZMatrixSolver<double>_*,_10> *)in_RDI);
  TPZStack<TPZMatrixSolver<double>_*,_10>::TPZStack
            ((TPZStack<TPZMatrixSolver<double>_*,_10> *)in_RDI);
  TPZStack<TPZCompMesh_*,_10>::Push((TPZStack<TPZCompMesh_*,_10> *)in_RDI,object);
  return;
}

Assistant:

TPZMGAnalysis::TPZMGAnalysis(TPZCompMesh *cmesh) : TPZLinearAnalysis(cmesh) {
	fMeshes.Push(cmesh);
}